

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

word Sfm_ObjFindCareSet(Abc_Ntk_t *pNtk,Vec_Int_t *vRoots)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Sfm_Dec_t *p_00;
  word wVar3;
  word wVar4;
  Abc_Ntk_t *local_40;
  word Res;
  int i;
  Abc_Obj_t *pObj;
  Sfm_Dec_t *p;
  Vec_Int_t *vRoots_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar2 = Abc_NtkPi(pNtk,0);
  p_00 = Sfm_DecMan(pAVar2);
  local_40 = (Abc_Ntk_t *)0x0;
  if (p_00->pPars->fUseSim == 0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    for (Res._4_4_ = 0; iVar1 = Vec_IntSize(vRoots), Res._4_4_ < iVar1; Res._4_4_ = Res._4_4_ + 1) {
      iVar1 = Vec_IntEntry(vRoots,Res._4_4_);
      pAVar2 = Abc_NtkObj(pNtk,iVar1);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        wVar3 = Sfm_DecObjSim(p_00,pAVar2);
        wVar4 = Sfm_DecObjSim2(p_00,pAVar2);
        local_40 = (Abc_Ntk_t *)(wVar3 ^ wVar4 | (ulong)local_40);
      }
    }
    pNtk_local = local_40;
  }
  return (word)pNtk_local;
}

Assistant:

static inline word Sfm_ObjFindCareSet( Abc_Ntk_t * pNtk, Vec_Int_t * vRoots )
{
    Sfm_Dec_t * p = Sfm_DecMan( Abc_NtkPi(pNtk, 0) );
    Abc_Obj_t * pObj; int i; word Res = 0;
    if ( !p->pPars->fUseSim )
        return 0;
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Res |= Sfm_DecObjSim(p, pObj) ^ Sfm_DecObjSim2(p, pObj);
    return Res;
}